

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  Op OVar1;
  IRContext *pIVar2;
  uint32_t uVar3;
  _Type member_idx;
  array<signed_char,_4UL> aVar4;
  const_iterator __cbeg;
  Instruction *pIVar5;
  Operand *__args;
  pointer pOVar6;
  char cVar7;
  ulong uVar8;
  bool bVar9;
  uint32_t index;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  OperandList new_operands;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  if (inst->opcode_ == OpCompositeExtract) {
LAB_005ab491:
    OVar1 = inst->opcode_;
    uVar13 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar13 = (uint)inst->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(inst,uVar13 + (OVar1 == OpSpecConstantOp));
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pIVar5 = analysis::DefUseManager::GetDef
                       ((pIVar2->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar3);
    index = 0;
    uVar3 = 0;
    if (pIVar5->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
    }
    local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      __args = Instruction::GetInOperand(inst,index);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 __args);
      index = index + 1;
    } while ((OVar1 == OpSpecConstantOp) + 1 != index);
    uVar13 = (uint)(OVar1 == OpSpecConstantOp);
    pOVar6 = (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(inst->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6;
    cVar7 = inst->has_type_id_;
    uVar11 = (uint)inst->has_result_id_;
    uVar10 = (uVar11 & 1) + 1;
    if ((bool)cVar7 == false) {
      uVar10 = (uint)inst->has_result_id_;
    }
    uVar12 = (int)(uVar8 >> 4) * -0x55555555 - uVar10;
    bVar9 = false;
    do {
      uVar13 = uVar13 + 1;
      if (uVar12 <= uVar13) {
        if (bVar9) {
          if (cVar7 != '\0') {
            uVar11 = (uVar11 & 1) + 1;
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (&inst->operands_,
                     (Operand *)
                     ((long)((pOVar6->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar11 * 0x30)),
                     (Operand *)((long)((pOVar6->words).buffer + 0xfffffffffffffffa) + uVar8));
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &inst->operands_,
                     (inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     local_48.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
            analysis::DefUseManager::UpdateDefUse
                      ((pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,inst);
          }
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_48);
        return bVar9;
      }
      member_idx = (_Type)Instruction::GetSingleWordOperand(inst,uVar10 + uVar13);
      aVar4._M_elems = (_Type)GetNewMemberIndex(this,uVar3,(uint32_t)member_idx);
      if (aVar4._M_elems == (_Type)0xffffffff) {
        __assert_fail("new_member_idx != kRemovedMember",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                      ,0x241,
                      "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                     );
      }
      if (member_idx != aVar4._M_elems) {
        bVar9 = true;
      }
      local_a0._0_8_ = &PTR__SmallVector_009488e0;
      local_a0._24_8_ = local_a0 + 0x10;
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._8_8_ = 1;
      local_78._0_4_ = SPV_OPERAND_TYPE_LITERAL_INTEGER;
      local_78._8_8_ = &PTR__SmallVector_009488e0;
      local_78._16_8_ = 0;
      local_78._32_8_ = local_78 + 0x18;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._16_4_ = aVar4._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_a0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
      local_78._8_8_ = &PTR__SmallVector_009488e0;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._0_8_ = &PTR__SmallVector_009488e0;
      if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,local_80._M_head_impl);
      }
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar2);
      }
      pIVar5 = analysis::DefUseManager::GetDef
                         ((pIVar2->def_use_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                          _M_head_impl,uVar3);
      OVar1 = pIVar5->opcode_;
      if ((int)OVar1 < 0x1168) {
        if (OpTypeStruct < OVar1) {
LAB_005ab7e2:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                        ,0x259,
                        "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                       );
        }
        if ((0x31800000U >> (OVar1 & OpTypeOpaque) & 1) != 0) goto LAB_005ab6ad;
        if (OVar1 != OpTypeStruct) goto LAB_005ab7e2;
        uVar10 = (pIVar5->has_result_id_ & 1) + 1;
        if (pIVar5->has_type_id_ == false) {
          uVar10 = (uint)pIVar5->has_result_id_;
        }
        uVar3 = uVar10 + (int)aVar4._M_elems;
      }
      else {
        if (((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeVectorNV)) &&
           (OVar1 != OpTypeCooperativeMatrixNV)) goto LAB_005ab7e2;
LAB_005ab6ad:
        uVar3 = (pIVar5->has_result_id_ & 1) + 1;
        if (pIVar5->has_type_id_ == false) {
          uVar3 = (uint)pIVar5->has_result_id_;
        }
      }
      uVar3 = Instruction::GetSingleWordOperand(pIVar5,uVar3);
      pOVar6 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(inst->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6;
      cVar7 = inst->has_type_id_;
      uVar11 = (uint)inst->has_result_id_;
      uVar10 = (uVar11 & 1) + 1;
      if ((bool)cVar7 == false) {
        uVar10 = uVar11;
      }
      uVar12 = (int)(uVar8 >> 4) * -0x55555555 - uVar10;
    } while( true );
  }
  if (inst->opcode_ == OpSpecConstantOp) {
    uVar3 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar3 = (uint)inst->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(inst,uVar3);
    if (uVar3 == 0x51) goto LAB_005ab491;
  }
  __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeExtract)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x22f,
                "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
               );
}

Assistant:

bool EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeExtract));

  uint32_t first_operand = 0;
  if (inst->opcode() == spv::Op::OpSpecConstantOp) {
    first_operand = 1;
  }
  uint32_t object_id = inst->GetSingleWordInOperand(first_operand);
  Instruction* object_inst = get_def_use_mgr()->GetDef(object_id);
  uint32_t type_id = object_inst->type_id();

  Instruction::OperandList new_operands;
  bool modified = false;
  for (uint32_t i = 0; i < first_operand + 1; i++) {
    new_operands.emplace_back(inst->GetInOperand(i));
  }
  for (uint32_t i = first_operand + 1; i < inst->NumInOperands(); ++i) {
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
    assert(new_member_idx != kRemovedMember);
    if (member_idx != new_member_idx) {
      modified = true;
    }
    new_operands.emplace_back(
        Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));

    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        // The type will have already been rewritten, so use the new member
        // index.
        type_id = type_inst->GetSingleWordInOperand(new_member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }

  if (!modified) {
    return false;
  }
  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}